

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O1

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::checkDeviceBufferTypeIs
          (ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *this,DeviceBufferType targetType)

{
  size_type *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  DeviceBufferType *in_RDX;
  ulong uVar6;
  undefined8 uVar7;
  DeviceBufferType local_bc;
  string local_b8;
  ulong *local_98;
  DeviceBufferType *local_90;
  ulong local_88;
  long lStack_80;
  string local_78;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  if (this->deviceBufferType == targetType) {
    return;
  }
  local_bc = targetType;
  deviceBufferTypeName_abi_cxx11_(&local_38,(polyscope *)&local_bc,in_RDX);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x34b55e);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_48 = *plVar4;
    lStack_40 = plVar2[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar4;
    local_58 = (long *)*plVar2;
  }
  local_50 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_88 = *puVar5;
    lStack_80 = plVar2[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *puVar5;
    local_98 = (ulong *)*plVar2;
  }
  local_90 = (DeviceBufferType *)plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  deviceBufferTypeName_abi_cxx11_(&local_78,(polyscope *)&this->deviceBufferType,local_90);
  uVar6 = 0xf;
  if (local_98 != &local_88) {
    uVar6 = local_88;
  }
  if (uVar6 < local_78._M_string_length + (long)local_90) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar7 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + (long)local_90 <= (ulong)uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_98);
      goto LAB_00215a19;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
LAB_00215a19:
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  psVar1 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_b8.field_2._M_allocated_capacity = *psVar1;
    local_b8.field_2._8_8_ = puVar3[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar1;
    local_b8._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_b8._M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  exception(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ManagedBuffer<T>::checkDeviceBufferTypeIs(DeviceBufferType targetType) {
  if (targetType != deviceBufferType) {
    exception("ManagedBuffer has wrong type for this operation. Expected " + deviceBufferTypeName(targetType) +
              " but is " + deviceBufferTypeName(deviceBufferType));
  }
}